

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_WEB(effect_handler_context_t_conflict *context)

{
  wchar_t idx;
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  monster *pmVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc grid;
  
  idx = cave->mon_current;
  if (L'\0' < idx) {
    pmVar4 = cave_monster(cave,idx);
    context->ident = true;
    wVar6 = pmVar4->race->spell_power;
    wVar6 = (uint)(L'(' < wVar6) + (uint)(L'P' < wVar6) + L'\x01';
    iVar2 = (pmVar4->grid).y;
    for (wVar7 = iVar2 - wVar6; wVar7 <= iVar2 + wVar6; wVar7 = wVar7 + L'\x01') {
      iVar2 = (pmVar4->grid).x;
      for (wVar5 = iVar2 - wVar6; wVar5 <= iVar2 + wVar6; wVar5 = wVar5 + L'\x01') {
        grid.y = wVar7;
        grid.x = wVar5;
        wVar3 = distance((loc_conflict)grid,pmVar4->grid);
        if (wVar3 <= wVar6) {
          _Var1 = square_in_bounds_fully(cave,grid);
          if (_Var1) {
            _Var1 = square_iswebbable(cave,grid);
            if (_Var1) {
              square_add_web(cave,grid);
            }
          }
        }
        iVar2 = (pmVar4->grid).x;
      }
      iVar2 = (pmVar4->grid).y;
    }
  }
  return L'\0' < idx;
}

Assistant:

bool effect_handler_WEB(effect_handler_context_t *context)
{
	int rad = 1;
	struct monster *mon = NULL;
	struct loc grid;

	/* Get the monster creating */
	if (cave->mon_current > 0) {
		mon = cave_monster(cave, cave->mon_current);
	} else {
		/* Player can't currently create webs */
		return false;
	}

	/* Always notice */
	context->ident = true;

	/* Increase the radius for higher spell power */
	if (mon->race->spell_power > 40) rad++;
	if (mon->race->spell_power > 80) rad++;

	/* Check within the radius for clear floor */
	for (grid.y = mon->grid.y - rad; grid.y <= mon->grid.y + rad; grid.y++) {
		for (grid.x = mon->grid.x - rad; grid.x <= mon->grid.x + rad; grid.x++){
			if (distance(grid, mon->grid) > rad ||
				!square_in_bounds_fully(cave, grid)) continue;

			/* Require a floor grid with no existing traps or glyphs */
			if (!square_iswebbable(cave, grid)) continue;

			/* Create a web */
			square_add_web(cave, grid);
		}
	}

	return true;
}